

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

void __thiscall translate::translate(translate *this,shared_ptr<hittable> *object,vec3 *offset)

{
  double dVar1;
  element_type *peVar2;
  aabb local_90;
  aabb local_60;
  vec3 *local_20;
  vec3 *offset_local;
  shared_ptr<hittable> *object_local;
  translate *this_local;
  
  local_20 = offset;
  offset_local = (vec3 *)object;
  object_local = (shared_ptr<hittable> *)this;
  hittable::hittable(&this->super_hittable);
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__translate_00133c10;
  std::shared_ptr<hittable>::shared_ptr(&this->object,object);
  (this->offset).e[2] = local_20->e[2];
  dVar1 = local_20->e[1];
  (this->offset).e[0] = local_20->e[0];
  (this->offset).e[1] = dVar1;
  aabb::aabb(&this->bbox);
  peVar2 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      object);
  (*peVar2->_vptr_hittable[3])(&local_90);
  operator+(&local_60,&local_90,local_20);
  memcpy(&this->bbox,&local_60,0x30);
  return;
}

Assistant:

translate(shared_ptr<hittable> object, const vec3& offset)
      : object(object), offset(offset)
    {
        bbox = object->bounding_box() + offset;
    }